

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_serializer.cpp
# Opt level: O3

void __thiscall Net::Zip(Net *this,string *FileName)

{
  pointer pvVar1;
  char cVar2;
  long *plVar3;
  long *plVar4;
  size_t i;
  long lVar5;
  uint8_t buf [4];
  ofstream out;
  undefined8 local_260;
  long local_258;
  long local_250;
  long lStack_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  long local_220;
  filebuf local_218 [240];
  ios_base local_128 [264];
  
  std::ofstream::ofstream(&local_220,(string *)FileName,_S_bin);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    local_260._0_4_ = this->function_type;
    lVar5 = 0;
    do {
      local_240._M_dataplus._M_p._0_1_ = *(undefined1 *)((long)&local_260 + lVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_220,(char *)&local_240,1)
      ;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    pvVar1 = (this->mesh).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_260 = (long *)CONCAT44(local_260._4_4_,
                                 (int)((ulong)((long)*(pointer *)
                                                      ((long)&(pvVar1->
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  )._M_impl.super__Vector_impl_data + 8) -
                                              *(long *)&(pvVar1->
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  )._M_impl.super__Vector_impl_data) >> 3));
    lVar5 = 0;
    do {
      local_240._M_dataplus._M_p._0_1_ = *(undefined1 *)((long)&local_260 + lVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_220,(char *)&local_240,1)
      ;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    net_serializer<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_void>
    ::serialize((ostream *)&local_220,&this->biases);
    net_serializer<std::vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>,_void>
    ::serialize((ostream *)&local_220,&this->weights);
    local_220 = _VTT;
    *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = _log;
    std::filebuf::~filebuf(local_218);
    std::ios_base::~ios_base(local_128);
    return;
  }
  std::operator+(&local_240,"File ",FileName);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_240);
  local_260 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_260 == plVar4) {
    local_250 = *plVar4;
    lStack_248 = plVar3[3];
    local_260 = &local_250;
  }
  else {
    local_250 = *plVar4;
  }
  local_258 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::operator<<((ostream *)&std::cerr,(string *)&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  exit(1);
}

Assistant:

void Net::Zip(const std::string& FileName){
    std::ofstream out(FileName, std::ios::binary);
    if (!out.is_open()){
        std::cerr << "File "+FileName+" can't be written to\n";
        exit(EXIT_FAILURE);
    }
    net_serializer<int>::serialize(out, (int)function_type);
    net_serializer<int>::serialize(out, (int)mesh[0].size());
    net_serializer<decltype(biases)>::serialize(out, biases);
    net_serializer<decltype(weights)>::serialize(out, weights);
}